

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addressmap-inl.h
# Opt level: O1

bool __thiscall
AddressMap<HeapProfileTable::AllocValue>::FindAndRemove
          (AddressMap<HeapProfileTable::AllocValue> *this,Key key,AllocValue *removed_value)

{
  Entry *pEVar1;
  uintptr_t uVar2;
  Entry *e;
  long *plVar3;
  Entry *pEVar4;
  
  plVar3 = (long *)((ulong)((uint)((int)((ulong)key >> 0x14) * -0x61c88647) >> 0x11 & 0xfffffff8) +
                   (long)this->hashtable_);
  do {
    plVar3 = (long *)*plVar3;
    if (plVar3 == (long *)0x0) {
      plVar3 = (long *)0x0;
      break;
    }
  } while (plVar3[1] != (ulong)key >> 0x14);
  if (plVar3 != (long *)0x0) {
    pEVar1 = (Entry *)((long)plVar3 + (ulong)((uint)((ulong)key >> 4) & 0xfff8) + 0x10);
    while (pEVar4 = pEVar1, pEVar1 = pEVar4->next, pEVar1 != (Entry *)0x0) {
      if (pEVar1->key == key) {
        uVar2 = (pEVar1->value).bucket_rep;
        removed_value->bytes = (pEVar1->value).bytes;
        removed_value->bucket_rep = uVar2;
        pEVar4->next = pEVar1->next;
        pEVar1->next = this->free_;
        this->free_ = pEVar1;
        return true;
      }
    }
  }
  return false;
}

Assistant:

Cluster* FindCluster(Number address, bool create) {
    // Look in hashtable
    const Number cluster_id = address >> (kBlockBits + kClusterBits);
    const int h = HashInt(cluster_id);
    for (Cluster* c = hashtable_[h]; c != nullptr; c = c->next) {
      if (c->id == cluster_id) {
        return c;
      }
    }

    // Create cluster if necessary
    if (create) {
      Cluster* c = New<Cluster>(1);
      c->id = cluster_id;
      c->next = hashtable_[h];
      hashtable_[h] = c;
      return c;
    }
    return nullptr;
  }